

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wast-parser.cc
# Opt level: O0

void wabt::anon_unknown_1::ResolveImplicitlyDefinedFunctionType
               (Location *loc,Module *module,FuncDeclaration *decl)

{
  Index IVar1;
  pointer pFVar2;
  pointer pTVar3;
  unique_ptr<wabt::TypeModuleField,_std::default_delete<wabt::TypeModuleField>_> local_40;
  unique_ptr<wabt::FuncType,_std::default_delete<wabt::FuncType>_> local_38;
  unique_ptr<wabt::FuncType,_std::default_delete<wabt::FuncType>_> func_type;
  unique_ptr<wabt::TypeModuleField,_std::default_delete<wabt::TypeModuleField>_> func_type_field;
  Index func_type_index;
  FuncDeclaration *decl_local;
  Module *module_local;
  Location *loc_local;
  
  if (((decl->has_func_type & 1U) == 0) &&
     (IVar1 = Module::GetFuncTypeIndex(module,&decl->sig), IVar1 == 0xffffffff)) {
    MakeUnique<wabt::TypeModuleField,wabt::Location_const&>((wabt *)&func_type,loc);
    MakeUnique<wabt::FuncType>();
    pFVar2 = std::unique_ptr<wabt::FuncType,_std::default_delete<wabt::FuncType>_>::operator->
                       (&local_38);
    FuncSignature::operator=(&pFVar2->sig,&decl->sig);
    pTVar3 = std::unique_ptr<wabt::TypeModuleField,_std::default_delete<wabt::TypeModuleField>_>::
             operator->((unique_ptr<wabt::TypeModuleField,_std::default_delete<wabt::TypeModuleField>_>
                         *)&func_type);
    std::unique_ptr<wabt::TypeEntry,std::default_delete<wabt::TypeEntry>>::operator=
              ((unique_ptr<wabt::TypeEntry,std::default_delete<wabt::TypeEntry>> *)&pTVar3->type,
               &local_38);
    std::unique_ptr<wabt::TypeModuleField,_std::default_delete<wabt::TypeModuleField>_>::unique_ptr
              (&local_40,
               (unique_ptr<wabt::TypeModuleField,_std::default_delete<wabt::TypeModuleField>_> *)
               &func_type);
    Module::AppendField(module,&local_40);
    std::unique_ptr<wabt::TypeModuleField,_std::default_delete<wabt::TypeModuleField>_>::~unique_ptr
              (&local_40);
    std::unique_ptr<wabt::FuncType,_std::default_delete<wabt::FuncType>_>::~unique_ptr(&local_38);
    std::unique_ptr<wabt::TypeModuleField,_std::default_delete<wabt::TypeModuleField>_>::~unique_ptr
              ((unique_ptr<wabt::TypeModuleField,_std::default_delete<wabt::TypeModuleField>_> *)
               &func_type);
  }
  return;
}

Assistant:

void ResolveImplicitlyDefinedFunctionType(const Location& loc,
                                          Module* module,
                                          const FuncDeclaration& decl) {
  // Resolve implicitly defined function types, e.g.: (func (param i32) ...)
  if (!decl.has_func_type) {
    Index func_type_index = module->GetFuncTypeIndex(decl.sig);
    if (func_type_index == kInvalidIndex) {
      auto func_type_field = MakeUnique<TypeModuleField>(loc);
      auto func_type = MakeUnique<FuncType>();
      func_type->sig = decl.sig;
      func_type_field->type = std::move(func_type);
      module->AppendField(std::move(func_type_field));
    }
  }
}